

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

bool AreCompatiblePointerTypes(PType *dest,PType *source,bool forcompare)

{
  _func_int **pp_Var1;
  bool bVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  _func_int *p_Var6;
  PClass *pPVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  PPointer *totype;
  PPointer *fromtype;
  bool bVar10;
  byte bVar11;
  
  pPVar7 = PPointer::RegistrationInfo.MyClass;
  if ((dest->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(dest->super_PTypeBase).super_DObject._vptr_DObject)(dest);
    (dest->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
  }
  pPVar3 = PPointer::RegistrationInfo.MyClass;
  pPVar5 = (dest->super_PTypeBase).super_DObject.Class;
  bVar10 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar7 && bVar10) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar10 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar7) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (bVar10) {
    if ((source->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(source->super_PTypeBase).super_DObject._vptr_DObject)(source);
      (source->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    pPVar5 = PClass::RegistrationInfo.MyClass;
    pPVar7 = (source->super_PTypeBase).super_DObject.Class;
    bVar10 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar3 && bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar10) {
      if ((forcompare) ||
         (*(char *)&dest[1].super_PTypeBase.super_DObject.Class ==
          *(char *)&source[1].super_PTypeBase.super_DObject.Class)) {
        if (source == dest) goto LAB_0052502b;
        pp_Var8 = source[1].super_PTypeBase.super_DObject._vptr_DObject;
        if (pp_Var8[1] == (_func_int *)0x0) {
          p_Var6 = (_func_int *)(**(code **)*pp_Var8)(pp_Var8);
          pp_Var8[1] = p_Var6;
        }
        pPVar3 = PClass::RegistrationInfo.MyClass;
        pPVar7 = (PClass *)pp_Var8[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        bVar11 = (byte)pPVar7;
        bVar2 = true;
        if (bVar10) {
          pp_Var8 = dest[1].super_PTypeBase.super_DObject._vptr_DObject;
          if (pp_Var8[1] == (_func_int *)0x0) {
            p_Var6 = (_func_int *)(**(code **)*pp_Var8)(pp_Var8);
            pp_Var8[1] = p_Var6;
          }
          pPVar7 = (PClass *)pp_Var8[1];
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          bVar11 = (byte)pPVar7;
          if (bVar10) {
            pp_Var8 = source[1].super_PTypeBase.super_DObject._vptr_DObject;
            pp_Var1 = dest[1].super_PTypeBase.super_DObject._vptr_DObject;
            if (forcompare) {
              pp_Var9 = pp_Var1;
              if (pp_Var1 != pp_Var8) {
                do {
                  pp_Var9 = (_func_int **)pp_Var9[0x1a];
                  if (pp_Var9 == pp_Var8) break;
                } while (pp_Var9 != (_func_int **)0x0);
                if (pp_Var8 != pp_Var1 && pp_Var9 == (_func_int **)0x0) goto LAB_0052500e;
              }
            }
            else if (pp_Var8 != pp_Var1) {
LAB_0052500e:
              bVar2 = false;
              do {
                pp_Var8 = (_func_int **)pp_Var8[0x1a];
                bVar11 = pp_Var8 != (_func_int **)0x0;
                if (pp_Var8 == pp_Var1) break;
              } while (pp_Var8 != (_func_int **)0x0);
              goto LAB_0052502d;
            }
LAB_0052502b:
            bVar11 = 1;
            bVar2 = false;
          }
        }
      }
      else {
        bVar2 = false;
        bVar11 = 0;
      }
LAB_0052502d:
      if (!bVar2) goto LAB_00525034;
    }
  }
  bVar11 = 0;
LAB_00525034:
  return (bool)(bVar11 & 1);
}

Assistant:

static bool AreCompatiblePointerTypes(PType *dest, PType *source, bool forcompare = false)
{
	if (dest->IsKindOf(RUNTIME_CLASS(PPointer)) && source->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		// Pointers to different types are only compatible if both point to an object and the source type is a child of the destination type.
		auto fromtype = static_cast<PPointer *>(source);
		auto totype = static_cast<PPointer *>(dest);
		if (fromtype == nullptr) return true;
		if (!forcompare && totype->IsConst != fromtype->IsConst) return false;
		if (fromtype == totype) return true;
		if (fromtype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)) && totype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
		{
			auto fromcls = static_cast<PClass *>(fromtype->PointedType);
			auto tocls = static_cast<PClass *>(totype->PointedType);
			if (forcompare && tocls->IsDescendantOf(fromcls)) return true;
			return (fromcls->IsDescendantOf(tocls));
		}
	}
	return false;
}